

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.cpp
# Opt level: O0

void anon_unknown.dwarf_ae21a::replaceInPlace(Ref target,Ref value)

{
  bool bVar1;
  Value *pVVar2;
  Value *this;
  size_t sVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  bool local_21;
  ulong local_20;
  size_t i;
  Ref value_local;
  Ref target_local;
  
  i = (size_t)value.inst;
  value_local = target;
  pVVar2 = cashew::Ref::operator->(&value_local);
  bVar1 = cashew::Value::isArray(pVVar2);
  local_21 = false;
  if (bVar1) {
    pVVar2 = cashew::Ref::operator->((Ref *)&i);
    local_21 = cashew::Value::isArray(pVVar2);
  }
  if (local_21 != false) {
    pVVar2 = cashew::Ref::operator->(&value_local);
    this = cashew::Ref::operator->((Ref *)&i);
    sVar3 = cashew::Value::size(this);
    cashew::Value::setSize(pVVar2,sVar3);
    local_20 = 0;
    while( true ) {
      pVVar2 = cashew::Ref::operator->((Ref *)&i);
      sVar3 = cashew::Value::size(pVVar2);
      if (sVar3 <= local_20) break;
      puVar4 = (undefined8 *)cashew::Ref::operator[]((uint)&i);
      puVar5 = (undefined8 *)cashew::Ref::operator[]((uint)&value_local);
      *puVar5 = *puVar4;
      local_20 = local_20 + 1;
    }
    return;
  }
  __assert_fail("target->isArray() && value->isArray()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm2js.cpp"
                ,0x85,"void (anonymous namespace)::replaceInPlace(Ref, Ref)");
}

Assistant:

static void replaceInPlace(Ref target, Ref value) {
  assert(target->isArray() && value->isArray());
  target->setSize(value->size());
  for (size_t i = 0; i < value->size(); i++) {
    target[i] = value[i];
  }
}